

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

void __thiscall rw::Geometry::correctTristripWinding(Geometry *this)

{
  void *pvVar1;
  short sVar2;
  undefined2 uVar3;
  uint uVar4;
  MeshHeader *pMVar5;
  long lVar6;
  uint16 uVar7;
  uint16 uVar8;
  MeshHeader *pMVar9;
  void *__src;
  MeshHeader *pMVar10;
  MeshHeader *pMVar11;
  uint16 i;
  ushort uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  short sVar16;
  uint32 uVar17;
  byte bVar18;
  bool bVar19;
  
  pMVar5 = this->meshHeader;
  if ((pMVar5 != (MeshHeader *)0x0 && (this->flags & 0x1000000) == 0) && (pMVar5->flags == 1)) {
    this->meshHeader = (MeshHeader *)0x0;
    pMVar9 = allocateMeshes(this,(uint)pMVar5->numMeshes,0,1);
    pMVar9->flags = pMVar5->flags;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 581"
    ;
    __src = (void *)(*DAT_00144da8)((ulong)(pMVar5->totalIndices * 2) * 2,0x1000f);
    pMVar10 = pMVar5 + 1;
    pMVar11 = pMVar9 + 1;
    for (uVar12 = 0; uVar12 < pMVar5->numMeshes; uVar12 = uVar12 + 1) {
      pMVar11->totalIndices = 0;
      uVar4 = pMVar9->totalIndices;
      pvVar1 = (void *)((long)__src + (ulong)uVar4 * 2);
      *(void **)pMVar11 = pvVar1;
      uVar7 = pMVar10[1].numMeshes;
      uVar8 = pMVar10[1].serialNum;
      pMVar11[1].flags = pMVar10[1].flags;
      pMVar11[1].numMeshes = uVar7;
      pMVar11[1].serialNum = uVar8;
      uVar15 = 0;
      uVar13 = 0;
      bVar18 = 0;
      while( true ) {
        uVar14 = (uint)uVar15;
        uVar17 = pMVar10->totalIndices;
        if (uVar17 - 2 <= uVar13) break;
        lVar6 = *(long *)pMVar10;
        sVar16 = *(short *)(lVar6 + uVar13 * 2);
        sVar2 = *(short *)(lVar6 + 2 + uVar13 * 2);
        if (sVar16 == sVar2) {
          bVar18 = 0;
        }
        else {
          bVar19 = sVar2 == *(short *)(lVar6 + (ulong)((int)uVar13 + 2) * 2);
          if ((bool)(bVar19 | bVar18)) {
            bVar18 = !bVar19 & bVar18;
          }
          else {
            bVar18 = 1;
            if ((uVar15 & 1) != 0) {
              *(undefined2 *)((long)pvVar1 + uVar15 * 2) =
                   *(undefined2 *)((long)pvVar1 + (ulong)(uVar14 - 1) * 2);
              uVar14 = uVar14 + 1;
              sVar16 = *(short *)(lVar6 + uVar13 * 2);
            }
          }
        }
        uVar15 = (ulong)(uVar14 + 1);
        pMVar11->totalIndices = uVar14 + 1;
        *(short *)((long)pvVar1 + (ulong)uVar14 * 2) = sVar16;
        uVar13 = uVar13 + 1;
      }
      for (; uVar13 < uVar17; uVar13 = uVar13 + 1) {
        uVar3 = *(undefined2 *)(*(long *)pMVar10 + uVar13 * 2);
        uVar14 = (int)uVar15 + 1;
        pMVar11->totalIndices = uVar14;
        *(undefined2 *)((long)pvVar1 + uVar15 * 2) = uVar3;
        uVar17 = pMVar10->totalIndices;
        uVar15 = (ulong)uVar14;
      }
      pMVar9->totalIndices = (int)uVar15 + uVar4;
      pMVar10 = (MeshHeader *)&pMVar10[1].totalIndices;
      pMVar11 = (MeshHeader *)&pMVar11[1].totalIndices;
    }
    (*DAT_00144da0)(pMVar5);
    allocateMeshes(this,(uint)pMVar9->numMeshes,pMVar9->totalIndices,0);
    memcpy(*(void **)(this->meshHeader + 1),__src,(ulong)(this->meshHeader->totalIndices * 2));
    (*DAT_00144da0)(__src);
    return;
  }
  return;
}

Assistant:

void
Geometry::correctTristripWinding(void)
{
	MeshHeader *header = this->meshHeader;
	if(this->flags & NATIVE || header == nil ||
	   header->flags != MeshHeader::TRISTRIP)
		return;
	this->meshHeader = nil;
	// Allocate no indices, we realloc later
	MeshHeader *newhead = this->allocateMeshes(header->numMeshes, 0, 1);
	newhead->flags = header->flags;
	/* get a temporary working buffer */
	uint16 *indices = rwNewT(uint16, header->totalIndices*2,
		MEMDUR_FUNCTION | ID_GEOMETRY);

	Mesh *mesh = header->getMeshes();
	Mesh *newmesh = newhead->getMeshes();
	for(uint16 i = 0; i < header->numMeshes; i++){
		newmesh->numIndices = 0;
		newmesh->indices = &indices[newhead->totalIndices];
		newmesh->material = mesh->material;

		bool inStrip = 0;
		uint32 j;
		for(j = 0; j < mesh->numIndices-2; j++){
			/* Duplicate vertices indicate end of strip */
			if(mesh->indices[j] == mesh->indices[j+1] ||
			   mesh->indices[j+1] == mesh->indices[j+2])
				inStrip = 0;
			else if(!inStrip){
				/* Entering strip now,
				 * make sure winding is correct */
				inStrip = 1;
				if(newmesh->numIndices % 2){
					newmesh->indices[newmesh->numIndices] =
					  newmesh->indices[newmesh->numIndices-1];
					newmesh->numIndices++;
				}
			}
			newmesh->indices[newmesh->numIndices++] = mesh->indices[j];
		}
		for(; j < mesh->numIndices; j++)
			newmesh->indices[newmesh->numIndices++] = mesh->indices[j];
		newhead->totalIndices += newmesh->numIndices;

		mesh++;
		newmesh++;
	}
	rwFree(header);
	// Now allocate indices and copy them
	this->allocateMeshes(newhead->numMeshes, newhead->totalIndices, 0);
	memcpy(this->meshHeader->getMeshes()->indices, indices, this->meshHeader->totalIndices*2);
	rwFree(indices);
}